

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

deUint32 vkt::ubo::anon_unknown_0::getBlockMemberOffset
                   (int blockNdx,UniformBlock *block,Uniform *uniform,UniformLayout *layout)

{
  deUint32 dVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  string *psVar5;
  ostream *poVar6;
  StructType *this;
  pointer pSVar7;
  const_reference pvVar8;
  string local_1e8;
  int local_1c4;
  ConstIterator CStack_1c0;
  int uniformNdx;
  ConstIterator firstMember;
  VarType *local_1a8;
  VarType *curType;
  ostringstream name;
  UniformLayout *layout_local;
  Uniform *uniform_local;
  UniformBlock *block_local;
  int blockNdx_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&curType);
  local_1a8 = Uniform::getType(uniform);
  UniformBlock::getInstanceName_abi_cxx11_(block);
  lVar4 = std::__cxx11::string::length();
  if (lVar4 != 0) {
    psVar5 = UniformBlock::getBlockName_abi_cxx11_(block);
    poVar6 = std::operator<<((ostream *)&curType,(string *)psVar5);
    std::operator<<(poVar6,".");
  }
  psVar5 = Uniform::getName_abi_cxx11_(uniform);
  std::operator<<((ostream *)&curType,(string *)psVar5);
  while (bVar2 = VarType::isBasicType(local_1a8), ((bVar2 ^ 0xffU) & 1) != 0) {
    bVar2 = VarType::isArrayType(local_1a8);
    if (bVar2) {
      std::operator<<((ostream *)&curType,"[0]");
      local_1a8 = VarType::getElementType(local_1a8);
    }
    bVar2 = VarType::isStructType(local_1a8);
    if (bVar2) {
      this = VarType::getStruct(local_1a8);
      CStack_1c0 = StructType::begin(this);
      poVar6 = std::operator<<((ostream *)&curType,".");
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
               ::operator->(&stack0xfffffffffffffe40);
      psVar5 = StructMember::getName_abi_cxx11_(pSVar7);
      std::operator<<(poVar6,(string *)psVar5);
      pSVar7 = __gnu_cxx::
               __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
               ::operator->(&stack0xfffffffffffffe40);
      local_1a8 = StructMember::getType(pSVar7);
    }
  }
  std::__cxx11::ostringstream::str();
  iVar3 = UniformLayout::getUniformLayoutIndex(layout,blockNdx,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  local_1c4 = iVar3;
  pvVar8 = std::vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
           ::operator[](&layout->uniforms,(long)iVar3);
  dVar1 = pvVar8->offset;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&curType);
  return dVar1;
}

Assistant:

deUint32 getBlockMemberOffset (int blockNdx, const UniformBlock& block, const Uniform& uniform, const UniformLayout& layout)
{
	std::ostringstream	name;
	const VarType*		curType = &uniform.getType();

	if (block.getInstanceName().length() != 0)
		name << block.getBlockName() << ".";	// \note UniformLayoutEntry uses block name rather than instance name

	name << uniform.getName();

	while (!curType->isBasicType())
	{
		if (curType->isArrayType())
		{
			name << "[0]";
			curType = &curType->getElementType();
		}

		if (curType->isStructType())
		{
			const StructType::ConstIterator firstMember = curType->getStruct().begin();
			name << "." << firstMember->getName();
			curType = &firstMember->getType();
		}
	}

	const int uniformNdx = layout.getUniformLayoutIndex(blockNdx, name.str());
	DE_ASSERT(uniformNdx >= 0);

	return layout.uniforms[uniformNdx].offset;
}